

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Experiment.cpp
# Opt level: O3

shared_ptr<celero::Factory> __thiscall celero::Experiment::getFactory(Experiment *this)

{
  _Tuple_impl<0UL,_celero::Experiment::Impl_*,_std::default_delete<celero::Experiment::Impl>_> _Var1
  ;
  long lVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  element_type *in_RDI;
  shared_ptr<celero::Factory> sVar4;
  shared_ptr<celero::Factory> sVar5;
  
  _Var1.super__Head_base<0UL,_celero::Experiment::Impl_*,_false>._M_head_impl =
       (this->pimpl)._pimpl._M_t.
       super___uniq_ptr_impl<celero::Experiment::Impl,_std::default_delete<celero::Experiment::Impl>_>
       ._M_t.
       super__Tuple_impl<0UL,_celero::Experiment::Impl_*,_std::default_delete<celero::Experiment::Impl>_>
       .super__Head_base<0UL,_celero::Experiment::Impl_*,_false>;
  _Var3._M_pi = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                 ((long)_Var1.super__Head_base<0UL,_celero::Experiment::Impl_*,_false>._M_head_impl
                 + 0x28);
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)in_RDI = _Var3._M_pi;
  lVar2 = *(long *)((long)_Var1.super__Head_base<0UL,_celero::Experiment::Impl_*,_false>.
                          _M_head_impl + 0x30);
  *(long *)(in_RDI + 8) = lVar2;
  if (lVar2 != 0) {
    _Var3._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&__libc_single_threaded;
    if (__libc_single_threaded != '\0') {
      *(int *)(lVar2 + 8) = *(int *)(lVar2 + 8) + 1;
      sVar4.super___shared_ptr<celero::Factory,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&__libc_single_threaded;
      sVar4.super___shared_ptr<celero::Factory,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
      return (shared_ptr<celero::Factory>)
             sVar4.super___shared_ptr<celero::Factory,_(__gnu_cxx::_Lock_policy)2>;
    }
    LOCK();
    *(int *)(lVar2 + 8) = *(int *)(lVar2 + 8) + 1;
    UNLOCK();
  }
  sVar5.super___shared_ptr<celero::Factory,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var3._M_pi;
  sVar5.super___shared_ptr<celero::Factory,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (shared_ptr<celero::Factory>)
         sVar5.super___shared_ptr<celero::Factory,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Factory> Experiment::getFactory() const
{
	return this->pimpl->factory;
}